

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O2

void WebRtcIsac_InitializePitch
               (double *in,double old_lag,double old_gain,PitchAnalysisStruct *State,double *lags)

{
  double *pdVar1;
  long lVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_4338;
  double local_4328;
  double local_4308 [2];
  double local_42f8 [2];
  double local_42e8;
  double local_42d8 [2];
  double local_42c8 [2];
  double local_42b8;
  double dStack_42b0;
  double *local_42a0;
  double intrp_d;
  double intrp_c;
  double intrp_b;
  double intrp_a;
  double adStack_4278 [10];
  double adStack_4228 [10];
  int peaks [10];
  double *CorrSurf [25];
  double peak_vals [10];
  double corrvec1 [65];
  double corrvec2 [65];
  double buf_dec [192];
  double corrSurfBuff [1735];
  
  pdVar4 = corrSurfBuff + 10;
  for (lVar5 = 0; lVar5 != 0x19; lVar5 = lVar5 + 1) {
    CorrSurf[lVar5] = pdVar4;
    pdVar4 = pdVar4 + 0x45;
  }
  local_42a0 = lags;
  memset(corrSurfBuff,0,0x3638);
  memcpy(buf_dec,State,0x240);
  WebRtcIsac_DecimateAllpass(in,State->decimator_state,0xf0,buf_dec + 0x48);
  for (lVar5 = 0x48; lVar5 != 0xc0; lVar5 = lVar5 + 1) {
    buf_dec[lVar5] = buf_dec[lVar5 + -1] * 0.75 + corrvec2[lVar5 + 0x40] * -0.25 + buf_dec[lVar5];
  }
  memcpy(State,buf_dec + 0x78,0x240);
  PCorr(buf_dec,corrvec1);
  PCorr(buf_dec + 0x3c,corrvec2);
  dVar16 = log(old_lag * 0.5);
  dVar17 = old_gain * 4.0 * old_gain;
  dVar18 = 0.8;
  if (dVar17 <= 0.8) {
    dVar18 = dVar17;
  }
  for (lVar5 = 0; lVar5 != 0x41; lVar5 = lVar5 + 1) {
    dVar17 = log((double)((int)lVar5 + 8));
    dVar17 = exp((dVar17 - dVar16) * (dVar17 - dVar16) * -5.0);
    corrvec1[lVar5] = (dVar17 * dVar18 + 1.0) * corrvec1[lVar5];
  }
  lVar5 = 0x200;
  for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
    dVar18 = *(double *)((long)&DAT_001a3dd0 + lVar6);
    *(double *)((long)corrvec1 + lVar6) = *(double *)((long)corrvec1 + lVar6) * dVar18;
    *(double *)((long)corrvec2 + lVar6) = *(double *)((long)corrvec2 + lVar6) * dVar18;
    *(double *)((long)corrvec1 + lVar5) = *(double *)((long)corrvec1 + lVar5) * dVar18;
    *(double *)((long)corrvec2 + lVar5) = dVar18 * *(double *)((long)corrvec2 + lVar5);
    lVar5 = lVar5 + -8;
  }
  dVar18 = 0.0;
  uVar10 = 0;
  for (lVar5 = 0; lVar5 != 0x208; lVar5 = lVar5 + 8) {
    dVar16 = *(double *)((long)corrvec1 + lVar5) + *(double *)((long)corrvec2 + lVar5);
    if (dVar18 < dVar16) {
      uVar10 = (ulong)((long)CorrSurf[0xb] + lVar5 + (0x10 - (long)CorrSurf[0])) >> 3 & 0xffffffff;
    }
    *(double *)((long)CorrSurf[0xb] + lVar5 + 0x10) = dVar16;
    if (dVar16 <= dVar18) {
      dVar16 = dVar18;
    }
    dVar18 = dVar16;
  }
  uVar7 = (long)CorrSurf[0x16] + (0x68 - (long)CorrSurf[0]);
  lVar5 = 0;
  while (lVar5 != 0x36) {
    iVar12 = (int)lVar5;
    dVar16 = (double)(iVar12 + 0xc) / (double)(iVar12 + 0x17);
    dVar17 = dVar16 * 0.2 * (2.0 - dVar16);
    dVar16 = (corrvec1[lVar5] + corrvec2[lVar5 + 0xb]) * dVar17;
    uVar3 = (uint)uVar10;
    if (dVar18 < dVar16) {
      uVar3 = iVar12 + 2;
    }
    CorrSurf[0][lVar5 + 2] = dVar16;
    if (dVar16 <= dVar18) {
      dVar16 = dVar18;
    }
    dVar18 = (corrvec1[lVar5 + 0xb] + corrvec2[lVar5]) * dVar17;
    CorrSurf[0x16][lVar5 + 0xd] = dVar18;
    lVar5 = lVar5 + 1;
    uVar10 = uVar7 >> 3 & 0xffffffff;
    if (dVar18 <= dVar16) {
      uVar10 = (ulong)uVar3;
      dVar18 = dVar16;
    }
    uVar7 = uVar7 + 8;
  }
  iVar12 = 0x16;
  for (lVar5 = 0; uVar3 = (uint)uVar10, lVar5 != 0x1b8; lVar5 = lVar5 + 8) {
    dVar16 = (double)(iVar12 + -10) / (double)iVar12;
    dVar17 = dVar16 * 0.9 * (2.0 - dVar16);
    dVar22 = (*(double *)((long)corrvec1 + lVar5) + *(double *)((long)corrvec2 + lVar5 + 0x50)) *
             dVar17;
    *(double *)((long)CorrSurf[1] + lVar5 + 0x10) = dVar22;
    dVar16 = dVar18;
    if (dVar18 < dVar22) {
      uVar3 = (uint)((ulong)((long)CorrSurf[1] + lVar5 + (0x10 - (long)CorrSurf[0])) >> 3);
      dVar16 = dVar22;
    }
    dVar18 = (*(double *)((long)corrvec1 + lVar5 + 0x50) + *(double *)((long)corrvec2 + lVar5)) *
             dVar17;
    *(double *)((long)CorrSurf[0x15] + lVar5 + 0x60) = dVar18;
    uVar10 = (ulong)((long)CorrSurf[0x15] + lVar5 + (0x60 - (long)CorrSurf[0])) >> 3 & 0xffffffff;
    if (dVar18 <= dVar16) {
      uVar10 = (ulong)uVar3;
      dVar18 = dVar16;
    }
    iVar12 = iVar12 + 1;
  }
  pdVar4 = corrvec1 + 9;
  pdVar8 = corrvec2 + 9;
  lVar5 = 0x58;
  lVar11 = 0x58 - (long)CorrSurf[0];
  iVar12 = 0x15;
  lVar14 = 0x1c0;
  for (lVar6 = 2; lVar6 != 0xb; lVar6 = lVar6 + 1) {
    pdVar1 = CorrSurf[lVar6];
    lVar2 = *(long *)((long)CorrSurf + (ulong)(uint)((0x16 - (int)lVar6) * 8));
    iVar9 = 0xc;
    iVar13 = iVar12;
    for (lVar15 = 0; uVar3 = (uint)uVar10, lVar14 != lVar15; lVar15 = lVar15 + 8) {
      dVar17 = (2.0 - (double)iVar9 / (double)iVar13) * ((double)iVar9 / (double)iVar13);
      dVar16 = (*(double *)((long)corrvec1 + lVar15) + *(double *)((long)pdVar8 + lVar15)) * dVar17;
      if (dVar18 < dVar16) {
        uVar3 = (uint)((ulong)((long)pdVar1 + lVar15 + (0x10 - (long)CorrSurf[0])) >> 3);
      }
      *(double *)((long)pdVar1 + lVar15 + 0x10) = dVar16;
      if (dVar16 <= dVar18) {
        dVar16 = dVar18;
      }
      dVar18 = (*(double *)((long)pdVar4 + lVar15) + *(double *)((long)corrvec2 + lVar15)) * dVar17;
      *(double *)(lVar2 + lVar5 + lVar15) = dVar18;
      uVar10 = (ulong)(lVar2 + lVar11 + lVar15) >> 3 & 0xffffffff;
      if (dVar18 <= dVar16) {
        uVar10 = (ulong)uVar3;
        dVar18 = dVar16;
      }
      iVar13 = iVar13 + 1;
      iVar9 = iVar9 + 1;
    }
    iVar12 = iVar12 + -1;
    pdVar4 = pdVar4 + -1;
    pdVar8 = pdVar8 + -1;
    lVar14 = lVar14 + 8;
    lVar11 = lVar11 + -8;
    lVar5 = lVar5 + -8;
  }
  uVar3 = 0;
  uVar7 = 1;
  lVar5 = 0x198;
  while ((uVar7 < 0xc && (uVar3 != 10))) {
    pdVar4 = CorrSurf[uVar7];
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 8) {
      dVar16 = *(double *)((long)pdVar4 + lVar6 + 0x20);
      if ((((dVar18 * 0.6 < dVar16) &&
           (pdVar8 = (double *)((long)pdVar4 + lVar6 + -0x210),
           *pdVar8 <= dVar16 && dVar16 != *pdVar8)) &&
          (pdVar8 = (double *)((long)pdVar4 + lVar6 + -0x208),
          *pdVar8 <= dVar16 && dVar16 != *pdVar8)) &&
         ((pdVar8 = (double *)((long)pdVar4 + lVar6 + 0x248), *pdVar8 <= dVar16 && dVar16 != *pdVar8
          && (pdVar8 = (double *)((long)pdVar4 + lVar6 + 0x250),
             *pdVar8 <= dVar16 && dVar16 != *pdVar8)))) {
        lVar11 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        peaks[lVar11] = (int)((ulong)((long)pdVar4 + lVar6 + (0x20 - (long)CorrSurf[0])) >> 3);
        if (uVar3 == 10) {
          uVar3 = 10;
          break;
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 8;
  }
  uVar7 = 0xc;
  lVar5 = 0;
  while ((uVar7 < 0x16 && (uVar3 != 10))) {
    pdVar4 = CorrSurf[uVar7];
    for (lVar6 = lVar5; lVar6 != 0x1e0; lVar6 = lVar6 + 8) {
      dVar16 = *(double *)((long)pdVar4 + lVar6 + 0x28);
      if ((((dVar18 * 0.6 < dVar16) &&
           (pdVar8 = (double *)((long)pdVar4 + lVar6 + -0x208),
           *pdVar8 <= dVar16 && dVar16 != *pdVar8)) &&
          (pdVar8 = (double *)((long)pdVar4 + lVar6 + -0x200),
          *pdVar8 <= dVar16 && dVar16 != *pdVar8)) &&
         ((pdVar8 = (double *)((long)pdVar4 + lVar6 + 0x250), *pdVar8 <= dVar16 && dVar16 != *pdVar8
          && (pdVar8 = (double *)((long)pdVar4 + lVar6 + 600),
             *pdVar8 <= dVar16 && dVar16 != *pdVar8)))) {
        lVar11 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        peaks[lVar11] = (int)((ulong)((long)pdVar4 + lVar6 + (0x28 - (long)CorrSurf[0])) >> 3);
        if (uVar3 == 10) {
          uVar3 = 10;
          break;
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 8;
  }
  if ((int)uVar3 < 1) {
    iVar12 = (int)uVar10;
    dVar18 = (double)(iVar12 % 0x45 + 6);
    dVar16 = dVar18 + 11.0;
    if (iVar12 % 0x45 < 0xe) {
      dVar18 = 20.0;
    }
    dVar16 = dVar16 - (double)(iVar12 / 0x45);
  }
  else {
    uVar10 = 0;
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      iVar12 = peaks[uVar7];
      uVar10 = (ulong)iVar12;
      pdVar4 = CorrSurf[0] + uVar10;
      IntrepolFilter(CorrSurf[0] + (uVar10 - 0x46),&intrp_a);
      IntrepolFilter(CorrSurf[0] + (uVar10 - 1),&intrp_b);
      IntrepolFilter(pdVar4,&intrp_c);
      IntrepolFilter(CorrSurf[0] + uVar10 + 0x45,&intrp_d);
      dVar23 = intrp_a;
      dVar22 = intrp_b;
      dVar17 = intrp_c;
      dVar16 = intrp_d;
      dVar18 = (CorrSurf[0] + (uVar10 - 1))[1];
      dVar25 = intrp_b;
      if (intrp_b <= intrp_a) {
        dVar25 = intrp_a;
      }
      dVar19 = intrp_c;
      if (intrp_c <= dVar25) {
        dVar19 = dVar25;
      }
      dVar25 = intrp_d;
      if (intrp_d <= dVar19) {
        dVar25 = dVar19;
      }
      local_4328 = (double)(iVar12 % 0x45 + 6);
      adStack_4228[uVar7] = local_4328;
      local_4338 = (local_4328 + 11.0) - (double)(iVar12 / 0x45);
      adStack_4278[uVar7] = local_4338;
      if (dVar18 <= dVar25) {
        if ((intrp_a != dVar25) || (NAN(intrp_a) || NAN(dVar25))) {
          if ((intrp_b != dVar25) || (NAN(intrp_b) || NAN(dVar25))) {
            local_4328 = local_4328 + 0.5;
            adStack_4228[uVar7] = local_4328;
            if ((intrp_c != dVar25) || (NAN(intrp_c) || NAN(dVar25))) {
              local_4338 = local_4338 + -0.5;
              adStack_4278[uVar7] = local_4338;
              local_4308[0] = intrp_b;
              local_42d8[0] = intrp_c;
              local_42e8 = intrp_d;
              IntrepolFilter(pdVar4 + 0x8a,local_42f8);
              IntrepolFilter(pdVar4 + 0x8b,local_42c8);
              dVar22 = pdVar4[0x45];
              dVar17 = pdVar4[0x46];
              dVar16 = pdVar4[0x8b];
              dVar23 = dVar18;
            }
            else {
              local_4338 = local_4338 + 0.5;
              adStack_4278[uVar7] = local_4338;
              local_4308[0] = intrp_a;
              IntrepolFilter(pdVar4 + -0x45,local_42d8);
              local_42e8 = dVar17;
              local_42f8[0] = dVar16;
              IntrepolFilter(pdVar4 + 0x46,local_42c8);
              dVar17 = pdVar4[1];
              dVar16 = pdVar4[0x46];
              dVar23 = pdVar4[-0x45];
              dVar22 = dVar18;
            }
          }
          else {
            local_4328 = local_4328 + -0.5;
            adStack_4228[uVar7] = local_4328;
            local_4338 = local_4338 + -0.5;
            adStack_4278[uVar7] = local_4338;
            IntrepolFilter(pdVar4 + -0x47,local_4308);
            local_42d8[0] = dVar23;
            local_42e8 = dVar22;
            IntrepolFilter(pdVar4 + 0x44,local_42f8);
            local_42c8[0] = dVar16;
            dVar16 = pdVar4[0x45];
            dVar23 = pdVar4[-0x46];
            dVar22 = pdVar4[-1];
            dVar17 = dVar18;
          }
        }
        else {
          local_4328 = local_4328 + -0.5;
          adStack_4228[uVar7] = local_4328;
          local_4338 = local_4338 + 0.5;
          adStack_4278[uVar7] = local_4338;
          IntrepolFilter(pdVar4 + -0x8c,local_4308);
          IntrepolFilter(pdVar4 + -0x8b,local_42d8);
          local_42e8 = dVar23;
          local_42f8[0] = dVar22;
          local_42c8[0] = dVar17;
          dVar23 = pdVar4[-0x8b];
          dVar22 = pdVar4[-0x46];
          dVar16 = dVar18;
          dVar17 = pdVar4[-0x45];
        }
      }
      else {
        local_4308[0] = pdVar4[-0x46];
        local_42d8[0] = pdVar4[-0x45];
        local_42f8[0] = pdVar4[0x45];
        local_42c8[0] = pdVar4[0x46];
        local_42e8 = dVar18;
      }
      dVar18 = local_42e8;
      dVar20 = (local_42d8[0] + local_42f8[0]) * 0.5 - local_42e8;
      dVar26 = (local_4308[0] + local_42c8[0]) * 0.5 + -local_42e8;
      dVar25 = (((local_42e8 * -4.0 + dVar16 + dVar22 + dVar23 + dVar17) - dVar26) - dVar20) * -0.5;
      dVar19 = dVar25 - dVar26;
      if (dVar19 < 1e-07) {
LAB_001664e5:
        peak_vals[uVar7] = local_42e8;
      }
      else {
        dVar24 = (((dVar17 + dVar22) - dVar23) - dVar16) * -0.5;
        dVar25 = dVar25 - dVar20;
        if (dVar19 * dVar25 - dVar24 * dVar24 < 1e-07) goto LAB_001664e5;
        if (dVar19 < 0.0) {
          local_42b8 = dVar25;
          dStack_42b0 = dVar26;
          dVar19 = sqrt(dVar19);
          dVar25 = local_42b8;
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        dVar24 = dVar24 / dVar19;
        dVar25 = dVar25 - dVar24 * dVar24;
        if (dVar25 < 0.0) {
          local_42b8 = dVar19;
          dVar25 = sqrt(dVar25);
          dVar19 = local_42b8;
        }
        else {
          dVar25 = SQRT(dVar25);
        }
        dVar20 = (((dVar16 + dVar17) - dVar22) - dVar23) * 0.5;
        dVar17 = (((dVar17 + dVar23) - dVar22) - dVar16) * 0.5;
        dVar16 = dVar20 / dVar19;
        dVar25 = ((dVar17 - dVar16 * dVar24) / dVar25) / dVar25;
        dVar19 = ((dVar16 - dVar24 * dVar25) * 0.5) / dVar19;
        dVar25 = dVar25 * 0.5;
        dVar16 = dVar19 * dVar19 + dVar25 * dVar25;
        if (1.0 < dVar16) {
          dVar19 = dVar19 / dVar16;
        }
        dVar16 = (double)(~-(ulong)(1.0 < dVar16) & (ulong)dVar25 |
                         (ulong)(dVar25 / dVar16) & -(ulong)(1.0 < dVar16));
        peak_vals[uVar7] = (dVar20 * dVar19 + dVar17 * dVar16) * 0.5 + dVar18;
        adStack_4228[uVar7] = local_4328 + dVar19;
        adStack_4278[uVar7] = local_4338 + dVar16;
      }
    }
    dVar18 = 0.0;
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      dVar16 = peak_vals[uVar7];
      dVar17 = log(adStack_4228[uVar7] + adStack_4278[uVar7]);
      dVar17 = pow(0.85,dVar17);
      dVar17 = dVar17 * dVar16;
      if (dVar18 < dVar17) {
        uVar10 = uVar7;
      }
      uVar10 = uVar10 & 0xffffffff;
      if (dVar17 <= dVar18) {
        dVar17 = dVar18;
      }
      dVar18 = dVar17;
    }
    dVar17 = adStack_4228[(int)uVar10] + adStack_4228[(int)uVar10];
    dVar16 = adStack_4278[(int)uVar10] + adStack_4278[(int)uVar10];
    dVar18 = 20.0;
    if (20.0 <= dVar17) {
      dVar18 = dVar17;
    }
  }
  dVar17 = 20.0;
  if (20.0 <= dVar16) {
    dVar17 = dVar16;
  }
  auVar21._8_8_ = dVar17;
  auVar21._0_8_ = dVar18;
  auVar21 = minpd(_DAT_001a3dc0,auVar21);
  *local_42a0 = auVar21._0_8_;
  *(undefined1 (*) [16])(local_42a0 + 1) = auVar21;
  local_42a0[3] = auVar21._8_8_;
  return;
}

Assistant:

void WebRtcIsac_InitializePitch(const double *in,
                                const double old_lag,
                                const double old_gain,
                                PitchAnalysisStruct *State,
                                double *lags)
{
  double buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2];
  double ratio, log_lag, gain_bias;
  double bias;
  double corrvec1[PITCH_LAG_SPAN2];
  double corrvec2[PITCH_LAG_SPAN2];
  int m, k;
  // Allocating 10 extra entries at the begining of the CorrSurf
  double corrSurfBuff[10 + (2*PITCH_BW+3)*(PITCH_LAG_SPAN2+4)];
  double* CorrSurf[2*PITCH_BW+3];
  double *CorrSurfPtr1, *CorrSurfPtr2;
  double LagWin[3] = {0.2, 0.5, 0.98};
  int ind1, ind2, peaks_ind, peak, max_ind;
  int peaks[PITCH_MAX_NUM_PEAKS];
  double adj, gain_tmp;
  double corr, corr_max;
  double intrp_a, intrp_b, intrp_c, intrp_d;
  double peak_vals[PITCH_MAX_NUM_PEAKS];
  double lags1[PITCH_MAX_NUM_PEAKS];
  double lags2[PITCH_MAX_NUM_PEAKS];
  double T[3][3];
  int row;

  for(k = 0; k < 2*PITCH_BW+3; k++)
  {
    CorrSurf[k] = &corrSurfBuff[10 + k * (PITCH_LAG_SPAN2+4)];
  }
  /* reset CorrSurf matrix */
  memset(corrSurfBuff, 0, sizeof(double) * (10 + (2*PITCH_BW+3) * (PITCH_LAG_SPAN2+4)));

  //warnings -DH
  max_ind = 0;
  peak = 0;

  /* copy old values from state buffer */
  memcpy(buf_dec, State->dec_buffer, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* decimation; put result after the old values */
  WebRtcIsac_DecimateAllpass(in, State->decimator_state, PITCH_FRAME_LEN,
                             &buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2]);

  /* low-pass filtering */
  for (k = PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2; k++)
    buf_dec[k] += 0.75 * buf_dec[k-1] - 0.25 * buf_dec[k-2];

  /* copy end part back into state buffer */
  memcpy(State->dec_buffer, buf_dec+PITCH_FRAME_LEN/2, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* compute correlation for first and second half of the frame */
  PCorr(buf_dec, corrvec1);
  PCorr(buf_dec + PITCH_CORR_STEP2, corrvec2);

  /* bias towards pitch lag of previous frame */
  log_lag = log(0.5 * old_lag);
  gain_bias = 4.0 * old_gain * old_gain;
  if (gain_bias > 0.8) gain_bias = 0.8;
  for (k = 0; k < PITCH_LAG_SPAN2; k++)
  {
    ratio = log((double) (k + (PITCH_MIN_LAG/2-2))) - log_lag;
    bias = 1.0 + gain_bias * exp(-5.0 * ratio * ratio);
    corrvec1[k] *= bias;
  }

  /* taper correlation functions */
  for (k = 0; k < 3; k++) {
    gain_tmp = LagWin[k];
    corrvec1[k] *= gain_tmp;
    corrvec2[k] *= gain_tmp;
    corrvec1[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
    corrvec2[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
  }

  corr_max = 0.0;
  /* fill middle row of correlation surface */
  ind1 = 0;
  ind2 = 0;
  CorrSurfPtr1 = &CorrSurf[PITCH_BW][2];
  for (k = 0; k < PITCH_LAG_SPAN2; k++) {
    corr = corrvec1[ind1++] + corrvec2[ind2++];
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
  }
  /* fill first and last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW;
  CorrSurfPtr1 = &CorrSurf[0][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW][PITCH_BW+2];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.2 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill second and next to last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW-1;
  CorrSurfPtr1 = &CorrSurf[1][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-1][PITCH_BW+1];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+1; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.9 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill remainder of correlation surface */
  for (m = 2; m < PITCH_BW; m++) {
    ind1 = 0;
    ind2 = PITCH_BW - m;         /* always larger than ind1 */
    CorrSurfPtr1 = &CorrSurf[m][2];
    CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-m][PITCH_BW+2-m];
    for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+m; k++) {
      ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
      adj = ratio * (2.0 - ratio);    /* adjustment factor; inverse parabola as a function of ratio */
      corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
      CorrSurfPtr1[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
      }
      corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
      CorrSurfPtr2[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
      }
    }
  }

  /* threshold value to qualify as a peak */
  corr_max *= 0.6;

  peaks_ind = 0;
  /* find peaks */
  for (m = 1; m < PITCH_BW+1; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2; k < PITCH_LAG_SPAN2-PITCH_BW-2+m; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }
  for (m = PITCH_BW+1; m < 2*PITCH_BW; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2+m-PITCH_BW; k < PITCH_LAG_SPAN2-2; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }

  if (peaks_ind > 0) {
    /* examine each peak */
    CorrSurfPtr1 = &CorrSurf[0][0];
    for (k = 0; k < peaks_ind; k++) {
      peak = peaks[k];

      /* compute four interpolated values around current peak */
      IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)], &intrp_a);
      IntrepolFilter(&CorrSurfPtr1[peak - 1            ], &intrp_b);
      IntrepolFilter(&CorrSurfPtr1[peak                ], &intrp_c);
      IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)], &intrp_d);

      /* determine maximum of the interpolated values */
      corr = CorrSurfPtr1[peak];
      corr_max = intrp_a;
      if (intrp_b > corr_max) corr_max = intrp_b;
      if (intrp_c > corr_max) corr_max = intrp_c;
      if (intrp_d > corr_max) corr_max = intrp_d;

      /* determine where the peak sits and fill a 3x3 matrix around it */
      row = peak / (PITCH_LAG_SPAN2+4);
      lags1[k] = (double) ((peak - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
      lags2[k] = (double) (lags1[k] + PITCH_BW - row);
      if ( corr > corr_max ) {
        T[0][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
        T[2][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
        T[1][1] = corr;
        T[0][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        T[2][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        T[1][0] = intrp_a;
        T[0][1] = intrp_b;
        T[2][1] = intrp_c;
        T[1][2] = intrp_d;
      } else {
        if (intrp_a == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] += 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - 2*(PITCH_LAG_SPAN2+5)], &T[0][0]);
          IntrepolFilter(&CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)], &T[2][0]);
          T[1][1] = intrp_a;
          T[0][2] = intrp_b;
          T[2][2] = intrp_c;
          T[1][0] = CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)];
          T[0][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[2][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[1][2] = corr;
        } else if (intrp_b == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] -= 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+6)], &T[0][0]);
          T[2][0] = intrp_a;
          T[1][1] = intrp_b;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+3)], &T[0][2]);
          T[2][2] = intrp_d;
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[0][1] = CorrSurfPtr1[peak - 1];
          T[2][1] = corr;
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        } else if (intrp_c == corr_max) {
          lags1[k] += 0.5;
          lags2[k] += 0.5;
          T[0][0] = intrp_a;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)], &T[2][0]);
          T[1][1] = intrp_c;
          T[0][2] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)], &T[2][2]);
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[0][1] = corr;
          T[2][1] = CorrSurfPtr1[peak + 1];
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        } else {
          lags1[k] += 0.5;
          lags2[k] -= 0.5;
          T[0][0] = intrp_b;
          T[2][0] = intrp_c;
          T[1][1] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + 2*(PITCH_LAG_SPAN2+4)], &T[0][2]);
          IntrepolFilter(&CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)], &T[2][2]);
          T[1][0] = corr;
          T[0][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
          T[2][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
          T[1][2] = CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)];
        }
      }

      /* 2D parabolic interpolation gives more accurate lags and peak value */
      Intrpol2D(T, &lags1[k], &lags2[k], &peak_vals[k]);
    }

    /* determine the highest peak, after applying a bias towards short lags */
    corr_max = 0.0;
    for (k = 0; k < peaks_ind; k++) {
      corr = peak_vals[k] * pow(PITCH_PEAK_DECAY, log(lags1[k] + lags2[k]));
      if (corr > corr_max) {
        corr_max = corr;
        peak = k;
      }
    }

    lags1[peak] *= 2.0;
    lags2[peak] *= 2.0;

    if (lags1[peak] < (double) PITCH_MIN_LAG) lags1[peak] = (double) PITCH_MIN_LAG;
    if (lags2[peak] < (double) PITCH_MIN_LAG) lags2[peak] = (double) PITCH_MIN_LAG;
    if (lags1[peak] > (double) PITCH_MAX_LAG) lags1[peak] = (double) PITCH_MAX_LAG;
    if (lags2[peak] > (double) PITCH_MAX_LAG) lags2[peak] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[peak];
    lags[1] = lags1[peak];
    lags[2] = lags2[peak];
    lags[3] = lags2[peak];
  }
  else
  {
    row = max_ind / (PITCH_LAG_SPAN2+4);
    lags1[0] = (double) ((max_ind - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
    lags2[0] = (double) (lags1[0] + PITCH_BW - row);

    if (lags1[0] < (double) PITCH_MIN_LAG) lags1[0] = (double) PITCH_MIN_LAG;
    if (lags2[0] < (double) PITCH_MIN_LAG) lags2[0] = (double) PITCH_MIN_LAG;
    if (lags1[0] > (double) PITCH_MAX_LAG) lags1[0] = (double) PITCH_MAX_LAG;
    if (lags2[0] > (double) PITCH_MAX_LAG) lags2[0] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[0];
    lags[1] = lags1[0];
    lags[2] = lags2[0];
    lags[3] = lags2[0];
  }
}